

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyRecordUsageCache.cpp
# Opt level: O2

void __thiscall
Js::PropertyRecordUsageCache::PropertyRecordUsageCache
          (PropertyRecordUsageCache *this,StaticType *type,PropertyRecord *propertyRecord)

{
  ScriptContextPolymorphicInlineCache *pSVar1;
  
  Memory::WriteBarrierPtr<const_Js::PropertyRecord>::WriteBarrierSet
            (&this->propertyRecord,propertyRecord);
  (this->ldElemInlineCache).ptr = (PolymorphicInlineCache *)0x0;
  (this->stElemInlineCache).ptr = (PolymorphicInlineCache *)0x0;
  this->hitRate = 0;
  pSVar1 = ScriptContextPolymorphicInlineCache::New(1,(type->super_Type).javascriptLibrary.ptr);
  Memory::WriteBarrierPtr<Js::PolymorphicInlineCache>::WriteBarrierSet
            (&this->ldElemInlineCache,&pSVar1->super_PolymorphicInlineCache);
  pSVar1 = ScriptContextPolymorphicInlineCache::New(1,(type->super_Type).javascriptLibrary.ptr);
  Memory::WriteBarrierPtr<Js::PolymorphicInlineCache>::WriteBarrierSet
            (&this->stElemInlineCache,&pSVar1->super_PolymorphicInlineCache);
  return;
}

Assistant:

PropertyRecordUsageCache::PropertyRecordUsageCache(StaticType* type, const PropertyRecord* propertyRecord) :
        propertyRecord(propertyRecord),
        ldElemInlineCache(nullptr),
        stElemInlineCache(nullptr),
        hitRate(0)
    {
        // TODO: in future, might be worth putting these inline to avoid extra allocations. PIC copy API needs to be updated to support this though
        this->ldElemInlineCache = ScriptContextPolymorphicInlineCache::New(MinPropertyStringInlineCacheSize, type->GetLibrary());
        this->stElemInlineCache = ScriptContextPolymorphicInlineCache::New(MinPropertyStringInlineCacheSize, type->GetLibrary());
    }